

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndDisabled(void)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  int *piVar3;
  bool was_disabled;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (0 < GImGui->DisabledStackSize) {
    GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
    uVar1 = pIVar2->CurrentItemFlags;
    ImVector<int>::pop_back(&pIVar2->ItemFlagsStack);
    piVar3 = ImVector<int>::back(&pIVar2->ItemFlagsStack);
    pIVar2->CurrentItemFlags = *piVar3;
    if (((uVar1 & 4) != 0) && ((pIVar2->CurrentItemFlags & 4U) == 0)) {
      (pIVar2->Style).Alpha = pIVar2->DisabledAlphaBackup;
    }
    return;
  }
  __assert_fail("g.DisabledStackSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x1d25,"void ImGui::EndDisabled()");
}

Assistant:

void ImGui::EndDisabled()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DisabledStackSize > 0);
    g.DisabledStackSize--;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    //PopItemFlag();
    g.ItemFlagsStack.pop_back();
    g.CurrentItemFlags = g.ItemFlagsStack.back();
    if (was_disabled && (g.CurrentItemFlags & ImGuiItemFlags_Disabled) == 0)
        g.Style.Alpha = g.DisabledAlphaBackup; //PopStyleVar();
}